

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove6<(moira::Instr)71,(moira::Mode)9,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  StrWriter *in_RSI;
  Ea<(moira::Mode)6,_(moira::Size)1> *in_RDI;
  StrWriter *unaff_retaddr;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  Ea<(moira::Mode)9,_(moira::Size)1> src;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Align align;
  u16 in_stack_ffffffffffffffbe;
  Moira *in_stack_ffffffffffffffc0;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  Ea<(moira::Mode)6,_(moira::Size)1> *ea;
  
  ea = in_RDI;
  Op<(moira::Mode)9,(moira::Size)1>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Op<(moira::Mode)6,(moira::Size)1>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,(u32 *)in_stack_ffffffffffffffc0);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  align.raw = in_RDI[1].pc;
  StrWriter::operator<<(pSVar1,align);
  pSVar1 = StrWriter::operator<<(unaff_retaddr,(Ea<(moira::Mode)9,_(moira::Size)1> *)ea);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<((StrWriter *)CONCAT44(align.raw,in_stack_ffffffffffffffb0),in_RDI);
  return;
}

Assistant:

void
Moira::dasmMove6(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_IX,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}